

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O3

int32_t uloc_setKeywordValue_63
                  (char *keywordName,char *keywordValue,char *buffer,int32_t bufferCapacity,
                  UErrorCode *status)

{
  bool bVar1;
  long lVar2;
  UBool UVar3;
  char cVar4;
  int32_t sLength;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  char *__dest;
  char *__s;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  int sLength_00;
  int sLength_01;
  int iVar14;
  char keywordNameBuffer [25];
  CharString updatedKeysAndValues;
  char localeKeywordNameBuffer [25];
  char keywordValueBuffer [97];
  char local_151;
  int local_128;
  char local_118 [32];
  CharString local_f8;
  char local_b8 [32];
  char local_98 [104];
  
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&local_f8.buffer);
  local_f8.len = 0;
  *local_f8.buffer.ptr = '\0';
  iVar14 = -1;
  if (U_ZERO_ERROR < *status) goto LAB_002b77f7;
  if (((keywordName != (char *)0x0) && (1 < bufferCapacity)) && (*keywordName != '\0')) {
    sVar8 = strlen(buffer);
    iVar7 = (int)sVar8;
    if (iVar7 <= bufferCapacity) {
      sLength = locale_canonKeywordName(local_118,keywordName,status);
      iVar14 = 0;
      if (U_ZERO_ERROR < *status) goto LAB_002b77f7;
      uVar12 = 0;
      if ((keywordValue != (char *)0x0) && (cVar4 = *keywordValue, cVar4 != '\0')) {
        uVar13 = 0;
        do {
          UVar3 = uprv_isASCIILetter_63(cVar4);
          if (((UVar3 == '\0') && (9 < (byte)(keywordValue[uVar13] - 0x30U))) &&
             ((uVar5 = (byte)keywordValue[uVar13] - 0x2b, 0x34 < uVar5 ||
              ((0x10000000000015U >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) goto LAB_002b77ed;
          if (uVar13 == 0x60) goto LAB_002b7bf6;
          uVar12 = uVar13 + 1;
          local_98[uVar13] = keywordValue[uVar13];
          cVar4 = keywordValue[uVar13 + 1];
          uVar13 = uVar12;
        } while (cVar4 != '\0');
      }
      sLength_01 = (int)uVar12;
      local_98[uVar12 & 0xffffffff] = '\0';
      __dest = strchr(buffer,0x40);
      iVar14 = iVar7;
      if ((__dest == (char *)0x0) || (__dest[1] == '\0')) {
        if (sLength_01 == 0) goto LAB_002b77f7;
        iVar14 = iVar7 + sLength + sLength_01 + (uint)(__dest == (char *)0x0) + 1;
        if (iVar14 < bufferCapacity) {
          pcVar9 = buffer + iVar7;
          if (__dest != (char *)0x0) {
            pcVar9 = __dest;
          }
          *pcVar9 = '@';
          strcpy(pcVar9 + 1,local_118);
          pcVar9[(long)sLength + 1] = '=';
          strcpy(pcVar9 + (long)sLength + 2,local_98);
          goto LAB_002b77f7;
        }
      }
      else {
        local_151 = '@';
        bVar1 = false;
        pcVar9 = __dest;
        do {
          __s = strchr(pcVar9 + 1,0x3d);
          if (__s == (char *)0x0) goto LAB_002b77ed;
          do {
            pcVar10 = pcVar9 + 1;
            pcVar9 = pcVar9 + 1;
            pcVar11 = __s;
          } while (*pcVar10 == ' ');
          do {
            pcVar10 = pcVar11;
            if (pcVar10 <= pcVar9) {
              uVar12 = 0;
              if (pcVar10 == pcVar9) goto LAB_002b77ed;
              goto LAB_002b799b;
            }
            pcVar11 = pcVar10 + -1;
          } while (pcVar10[-1] == ' ');
          uVar13 = 0;
          do {
            UVar3 = uprv_isASCIILetter_63(pcVar9[uVar13]);
            if ((UVar3 == '\0') && (9 < (byte)(pcVar9[uVar13] - 0x30U))) goto LAB_002b77ed;
            if (uVar13 == 0x18) goto LAB_002b7bf6;
            cVar4 = uprv_asciitolower_63(pcVar9[uVar13]);
            uVar12 = uVar13 + 1;
            local_b8[uVar13] = cVar4;
            lVar2 = uVar13 + 1;
            uVar13 = uVar12;
          } while (pcVar9 + lVar2 < pcVar10);
LAB_002b799b:
          local_b8[uVar12 & 0xffffffff] = '\0';
          pcVar9 = strchr(__s,0x3b);
          uVar5 = ~(uint)__s;
          do {
            uVar6 = uVar5;
            pcVar10 = __s + 1;
            __s = __s + 1;
            uVar5 = uVar6 - 1;
          } while (*pcVar10 == ' ');
          pcVar10 = pcVar9;
          if (pcVar9 == (char *)0x0) {
            sVar8 = strlen(__s);
            pcVar10 = __s + sVar8;
          }
          iVar7 = uVar6 + (int)pcVar10;
          do {
            sLength_00 = iVar7;
            pcVar11 = pcVar10;
            if (pcVar11 <= __s) break;
            pcVar10 = pcVar11 + -1;
            iVar7 = sLength_00 + -1;
          } while (pcVar11[-1] == ' ');
          if (pcVar11 == __s) goto LAB_002b77ed;
          iVar7 = strcmp(local_118,local_b8);
          if (iVar7 == 0) {
            bVar1 = true;
            if (sLength_01 != 0) {
              icu_63::CharString::append(&local_f8,local_151,status);
              icu_63::CharString::append(&local_f8,local_118,sLength,status);
              icu_63::CharString::append(&local_f8,'=',status);
              local_151 = ';';
              icu_63::CharString::append(&local_f8,local_98,sLength_01,status);
            }
          }
          else {
            if ((!bVar1 && sLength_01 != 0) && iVar7 < 0) {
              icu_63::CharString::append(&local_f8,local_151,status);
              icu_63::CharString::append(&local_f8,local_118,sLength,status);
              icu_63::CharString::append(&local_f8,'=',status);
              icu_63::CharString::append(&local_f8,local_98,sLength_01,status);
              bVar1 = true;
              local_151 = ';';
            }
            icu_63::CharString::append(&local_f8,local_151,status);
            icu_63::CharString::append(&local_f8,local_b8,(int32_t)uVar12,status);
            icu_63::CharString::append(&local_f8,'=',status);
            icu_63::CharString::append(&local_f8,__s,sLength_00,status);
            local_151 = ';';
            if ((!bVar1 && pcVar9 == (char *)0x0) && sLength_01 != 0) {
              icu_63::CharString::append(&local_f8,';',status);
              icu_63::CharString::append(&local_f8,local_118,sLength,status);
              icu_63::CharString::append(&local_f8,'=',status);
              icu_63::CharString::append(&local_f8,local_98,sLength_01,status);
              goto LAB_002b7c64;
            }
          }
        } while (pcVar9 != (char *)0x0);
        if (!bVar1) goto LAB_002b77f7;
LAB_002b7c64:
        if (U_ZERO_ERROR < *status) goto LAB_002b77f7;
        local_128 = (int)buffer;
        iVar14 = ((int)__dest - local_128) + local_f8.len;
        if (iVar14 < bufferCapacity) {
          if (0 < local_f8.len) {
            strncpy(__dest,local_f8.buffer.ptr,(ulong)(uint)local_f8.len);
          }
          buffer[iVar14] = '\0';
          goto LAB_002b77f7;
        }
      }
      *status = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002b77f7;
    }
  }
LAB_002b77ed:
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  goto LAB_002b77f4;
LAB_002b7bf6:
  *status = U_INTERNAL_PROGRAM_ERROR;
LAB_002b77f4:
  iVar14 = 0;
LAB_002b77f7:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&local_f8.buffer);
  return iVar14;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_setKeywordValue(const char* keywordName,
                     const char* keywordValue,
                     char* buffer, int32_t bufferCapacity,
                     UErrorCode* status)
{
    /* TODO: sorting. removal. */
    int32_t keywordNameLen;
    int32_t keywordValueLen;
    int32_t bufLen;
    int32_t needLen = 0;
    char keywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    char keywordValueBuffer[ULOC_KEYWORDS_CAPACITY+1];
    char localeKeywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    int32_t rc;
    char* nextSeparator = NULL;
    char* nextEqualsign = NULL;
    char* startSearchHere = NULL;
    char* keywordStart = NULL;
    CharString updatedKeysAndValues;
    int32_t updatedKeysAndValuesLen;
    UBool handledInputKeyAndValue = FALSE;
    char keyValuePrefix = '@';

    if(U_FAILURE(*status)) {
        return -1;
    }
    if (keywordName == NULL || keywordName[0] == 0 || bufferCapacity <= 1) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    bufLen = (int32_t)uprv_strlen(buffer);
    if(bufferCapacity<bufLen) {
        /* The capacity is less than the length?! Is this NULL terminated? */
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    keywordNameLen = locale_canonKeywordName(keywordNameBuffer, keywordName, status);
    if(U_FAILURE(*status)) {
        return 0;
    }

    keywordValueLen = 0;
    if(keywordValue) {
        while (*keywordValue != 0) {
            if (!UPRV_ISALPHANUM(*keywordValue) && !UPRV_OK_VALUE_PUNCTUATION(*keywordValue)) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed key value */
                return 0;
            }
            if (keywordValueLen < ULOC_KEYWORDS_CAPACITY) {
                /* Should we force lowercase in value to set? */
                keywordValueBuffer[keywordValueLen++] = *keywordValue++;
            } else {
                /* keywordValue too long for internal buffer */
                *status = U_INTERNAL_PROGRAM_ERROR;
                return 0;
            }
        }
    }
    keywordValueBuffer[keywordValueLen] = 0; /* terminate */

    startSearchHere = (char*)locale_getKeywordsStart(buffer);
    if(startSearchHere == NULL || (startSearchHere[1]==0)) {
        if(keywordValueLen == 0) { /* no keywords = nothing to remove */
            return bufLen;
        }

        needLen = bufLen+1+keywordNameLen+1+keywordValueLen;
        if(startSearchHere) { /* had a single @ */
            needLen--; /* already had the @ */
            /* startSearchHere points at the @ */
        } else {
            startSearchHere=buffer+bufLen;
        }
        if(needLen >= bufferCapacity) {
            *status = U_BUFFER_OVERFLOW_ERROR;
            return needLen; /* no change */
        }
        *startSearchHere++ = '@';
        uprv_strcpy(startSearchHere, keywordNameBuffer);
        startSearchHere += keywordNameLen;
        *startSearchHere++ = '=';
        uprv_strcpy(startSearchHere, keywordValueBuffer);
        return needLen;
    } /* end shortcut - no @ */

    keywordStart = startSearchHere;
    /* search for keyword */
    while(keywordStart) {
        const char* keyValueTail;
        int32_t keyValueLen;

        keywordStart++; /* skip @ or ; */
        nextEqualsign = uprv_strchr(keywordStart, '=');
        if (!nextEqualsign) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* key must have =value */
            return 0;
        }
        /* strip leading & trailing spaces (TC decided to tolerate these) */
        while(*keywordStart == ' ') {
            keywordStart++;
        }
        keyValueTail = nextEqualsign;
        while (keyValueTail > keywordStart && *(keyValueTail-1) == ' ') {
            keyValueTail--;
        }
        /* now keyValueTail points to first char after the keyName */
        /* copy & normalize keyName from locale */
        if (keywordStart == keyValueTail) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name in passed-in locale */
            return 0;
        }
        keyValueLen = 0;
        while (keywordStart < keyValueTail) {
            if (!UPRV_ISALPHANUM(*keywordStart)) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
                return 0;
            }
            if (keyValueLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
                localeKeywordNameBuffer[keyValueLen++] = uprv_tolower(*keywordStart++);
            } else {
                /* keyword name too long for internal buffer */
                *status = U_INTERNAL_PROGRAM_ERROR;
                return 0;
            }
        }
        localeKeywordNameBuffer[keyValueLen] = 0; /* terminate */

        nextSeparator = uprv_strchr(nextEqualsign, ';');

        /* start processing the value part */
        nextEqualsign++; /* skip '=' */
        /* First strip leading & trailing spaces (TC decided to tolerate these) */
        while(*nextEqualsign == ' ') {
            nextEqualsign++;
        }
        keyValueTail = (nextSeparator)? nextSeparator: nextEqualsign + uprv_strlen(nextEqualsign);
        while(keyValueTail > nextEqualsign && *(keyValueTail-1) == ' ') {
            keyValueTail--;
        }
        if (nextEqualsign == keyValueTail) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty key value in passed-in locale */
            return 0;
        }

        rc = uprv_strcmp(keywordNameBuffer, localeKeywordNameBuffer);
        if(rc == 0) {
            /* Current entry matches the input keyword. Update the entry */
            if(keywordValueLen > 0) { /* updating a value */
                updatedKeysAndValues.append(keyValuePrefix, *status);
                keyValuePrefix = ';'; /* for any subsequent key-value pair */
                updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
                updatedKeysAndValues.append('=', *status);
                updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
            } /* else removing this entry, don't emit anything */
            handledInputKeyAndValue = TRUE;
        } else {
           /* input keyword sorts earlier than current entry, add before current entry */
            if (rc < 0 && keywordValueLen > 0 && !handledInputKeyAndValue) {
                /* insert new entry at this location */
                updatedKeysAndValues.append(keyValuePrefix, *status);
                keyValuePrefix = ';'; /* for any subsequent key-value pair */
                updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
                updatedKeysAndValues.append('=', *status);
                updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
                handledInputKeyAndValue = TRUE;
            }
            /* copy the current entry */
            updatedKeysAndValues.append(keyValuePrefix, *status);
            keyValuePrefix = ';'; /* for any subsequent key-value pair */
            updatedKeysAndValues.append(localeKeywordNameBuffer, keyValueLen, *status);
            updatedKeysAndValues.append('=', *status);
            updatedKeysAndValues.append(nextEqualsign, static_cast<int32_t>(keyValueTail-nextEqualsign), *status);
        }
        if (!nextSeparator && keywordValueLen > 0 && !handledInputKeyAndValue) {
            /* append new entry at the end, it sorts later than existing entries */
            updatedKeysAndValues.append(keyValuePrefix, *status);
            /* skip keyValuePrefix update, no subsequent key-value pair */
            updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
            updatedKeysAndValues.append('=', *status);
            updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
            handledInputKeyAndValue = TRUE;
        }
        keywordStart = nextSeparator;
    } /* end loop searching */

    /* Any error from updatedKeysAndValues.append above would be internal and not due to
     * problems with the passed-in locale. So if we did encounter problems with the
     * passed-in locale above, those errors took precedence and overrode any error
     * status from updatedKeysAndValues.append, and also caused a return of 0. If there
     * are errors here they are from updatedKeysAndValues.append; they do cause an
     * error return but the passed-in locale is unmodified and the original bufLen is
     * returned.
     */
    if (!handledInputKeyAndValue || U_FAILURE(*status)) {
        /* if input key/value specified removal of a keyword not present in locale, or
         * there was an error in CharString.append, leave original locale alone. */
        return bufLen;
    }

    updatedKeysAndValuesLen = updatedKeysAndValues.length();
    /* needLen = length of the part before '@' + length of updated key-value part including '@' */
    needLen = (int32_t)(startSearchHere - buffer) + updatedKeysAndValuesLen;
    if(needLen >= bufferCapacity) {
        *status = U_BUFFER_OVERFLOW_ERROR;
        return needLen; /* no change */
    }
    if (updatedKeysAndValuesLen > 0) {
        uprv_strncpy(startSearchHere, updatedKeysAndValues.data(), updatedKeysAndValuesLen);
    }
    buffer[needLen]=0;
    return needLen;
}